

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_segwit_tests.cpp
# Opt level: O2

bool script_segwit_tests::anon_unknown_20::IsExpectedWitnessProgram
               (CScript *script,int expectedVersion,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *expectedProgram)

{
  bool bVar1;
  iterator in_R8;
  iterator pvVar2;
  iterator in_R9;
  int *piVar3;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string file;
  const_string file_00;
  int *piVar4;
  char *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  assertion_result local_e0;
  undefined1 *local_c8;
  undefined1 *local_c0;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  lazy_ostream local_98;
  undefined1 *local_88;
  char **local_80;
  undefined1 *local_78;
  undefined1 *local_70;
  char *local_68;
  char *local_60;
  vector<unsigned_char,_std::allocator<unsigned_char>_> actualProgram;
  int actualVersion;
  int expectedVersion_local;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  actualProgram.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  actualProgram.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  actualProgram.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  expectedVersion_local = expectedVersion;
  bVar1 = CScript::IsWitnessProgram(script,&actualVersion,&actualProgram);
  if (bVar1) {
    local_68 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_segwit_tests.cpp"
    ;
    local_60 = "";
    local_78 = &boost::unit_test::basic_cstring<char_const>::null;
    local_70 = &boost::unit_test::basic_cstring<char_const>::null;
    msg.m_end = in_R9;
    msg.m_begin = in_R8;
    file.m_end = (iterator)0x4f;
    file.m_begin = (iterator)&local_68;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_78,msg);
    local_98.m_empty = false;
    local_98._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139f30;
    local_88 = boost::unit_test::lazy_ostream::inst;
    local_80 = (char **)0xc694e1;
    local_a8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_segwit_tests.cpp"
    ;
    local_a0 = "";
    piVar4 = &expectedVersion_local;
    pvVar2 = (iterator)0x2;
    piVar3 = &actualVersion;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_98,&local_a8,0x4f,1,2,piVar3,"actualVersion",piVar4,"expectedVersion");
    local_b8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_segwit_tests.cpp"
    ;
    local_b0 = "";
    local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_c0 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_00.m_end = (iterator)piVar3;
    msg_00.m_begin = pvVar2;
    file_00.m_end = &DAT_00000050;
    file_00.m_begin = (iterator)&local_b8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_c8,
               msg_00);
    local_e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)std::operator==(&actualProgram,expectedProgram);
    local_e0.m_message.px = (element_type *)0x0;
    local_e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_80 = &local_f0;
    local_f0 = "actualProgram == expectedProgram";
    local_e8 = "";
    local_98.m_empty = false;
    local_98._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
    local_88 = boost::unit_test::lazy_ostream::inst;
    local_100 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_segwit_tests.cpp"
    ;
    local_f8 = "";
    boost::test_tools::tt_detail::report_assertion
              (&local_e0,&local_98,1,0,WARN,(check_type)piVar4,(size_t)&local_100,0x50);
    boost::detail::shared_count::~shared_count(&local_e0.m_message.pn);
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&actualProgram.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool IsExpectedWitnessProgram(const CScript& script, const int expectedVersion, const std::vector<unsigned char>& expectedProgram)
{
    int actualVersion;
    std::vector<unsigned char> actualProgram;
    if (!script.IsWitnessProgram(actualVersion, actualProgram)) {
        return false;
    }
    BOOST_CHECK_EQUAL(actualVersion, expectedVersion);
    BOOST_CHECK(actualProgram == expectedProgram);
    return true;
}